

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Stress::anon_unknown_0::NameGenerator::beginScope(NameGenerator *this)

{
  size_type sVar1;
  reference pvVar2;
  value_type_conflict1 local_14;
  NameGenerator *local_10;
  NameGenerator *this_local;
  
  this->m_currentScopeDepth = this->m_currentScopeDepth + 1;
  local_10 = this;
  sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->m_scopeIndices);
  if (sVar1 < (ulong)(long)this->m_currentScopeDepth) {
    local_14 = 0;
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_scopeIndices,&local_14);
  }
  else {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->m_scopeIndices,(long)(this->m_currentScopeDepth + -1));
    *pvVar2 = *pvVar2 + 1;
  }
  this->m_variableIndex = 0;
  return;
}

Assistant:

void beginScope (void)
	{
		m_currentScopeDepth++;

		if (m_scopeIndices.size() < (size_t)m_currentScopeDepth)
			m_scopeIndices.push_back(0);
		else
			m_scopeIndices[m_currentScopeDepth-1]++;

		m_variableIndex = 0;
	}